

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O3

void __thiscall
CVmHashTable::enum_entries(CVmHashTable *this,_func_void_void_ptr_CVmHashEntry_ptr *func,void *ctx)

{
  CVmHashEntry *pCVar1;
  ulong uVar2;
  CVmHashEntry *pCVar3;
  CVmHashEntry **ppCVar4;
  ulong uVar5;
  
  uVar2 = this->table_size_;
  if (uVar2 != 0) {
    ppCVar4 = this->table_;
    uVar5 = 0;
    do {
      pCVar3 = *ppCVar4;
      if (*ppCVar4 != (CVmHashEntry *)0x0) {
        do {
          pCVar1 = pCVar3->nxt_;
          (*func)(ctx,pCVar3);
          pCVar3 = pCVar1;
        } while (pCVar1 != (CVmHashEntry *)0x0);
        uVar2 = this->table_size_;
      }
      uVar5 = uVar5 + 1;
      ppCVar4 = ppCVar4 + 1;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void CVmHashTable::enum_entries(void (*func)(void *, CVmHashEntry *),
                                void *ctx)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, in case the callback deletes the
             *   current entry 
             */
            nxt = entry->nxt_;

            /* invoke the callback on this entry */
            (*func)(ctx, entry);
        }
    }
}